

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

bool __thiscall
QLineEditPrivate::sendMouseEventToInputContext(QLineEditPrivate *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  Action AVar3;
  QPoint QVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QPointF local_50;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QWidgetLineControl::composeMode((QWidgetLineControl *)this->control);
  if (bVar1) {
    local_50 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar4 = QPointF::toPoint(&local_50);
    bVar1 = false;
    iVar2 = xToPos(this,QVar4.xp.m_i.m_i,CursorBetweenCharacters);
    uVar5 = iVar2 - this->control->m_cursor;
    if ((int)uVar5 < 0) goto LAB_003f26bf;
    QTextLayout::preeditAreaText();
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    if (uVar5 <= local_40) {
      bVar1 = true;
      if (*(short *)(e + 8) == 3) {
        AVar3 = QGuiApplication::inputMethod();
        QInputMethod::invokeAction(AVar3,0);
      }
      goto LAB_003f26bf;
    }
  }
  bVar1 = false;
LAB_003f26bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QLineEditPrivate::sendMouseEventToInputContext( QMouseEvent *e )
{
#if !defined QT_NO_IM
    if ( control->composeMode() ) {
        int tmp_cursor = xToPos(e->position().toPoint().x());
        int mousePos = tmp_cursor - control->cursor();
        if ( mousePos < 0 || mousePos > control->preeditAreaText().size() )
            mousePos = -1;

        if (mousePos >= 0) {
            if (e->type() == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, mousePos);

            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif

    return false;
}